

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptRegularExpression.cpp
# Opt level: O3

void __thiscall
Js::JavascriptRegExp::JavascriptRegExp
          (JavascriptRegExp *this,RegexPattern *pattern,DynamicType *type)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  ScriptContext *this_00;
  DebugWriter *this_01;
  
  DynamicObject::DynamicObject(&this->super_DynamicObject,type,true);
  (this->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
  super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject = (_func_int **)&PTR_Finalize_0152fff0;
  Memory::Recycler::WBSetBit((char *)&this->pattern);
  (this->pattern).ptr = pattern;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->pattern);
  (this->splitPattern).ptr = (RegexPattern *)0x0;
  (this->lastIndexVar).ptr = (void *)0x0;
  this->lastIndexOrFlag = 0;
  if ((type->super_Type).typeId != TypeIds_RegEx) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptRegularExpression.cpp"
                                ,0x14,"(type->GetTypeId() == TypeIds_RegEx)",
                                "type->GetTypeId() == TypeIds_RegEx");
    if (!bVar2) goto LAB_00d03d6e;
    *puVar4 = 0;
  }
  BVar3 = Js::Type::AreThisAndPrototypesEnsuredToHaveOnlyWritableDataProperties
                    ((this->super_DynamicObject).super_RecyclableObject.type.ptr);
  if (BVar3 != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptRegularExpression.cpp"
                                ,0x15,
                                "(!this->GetType()->AreThisAndPrototypesEnsuredToHaveOnlyWritableDataProperties())"
                                ,
                                "!this->GetType()->AreThisAndPrototypesEnsuredToHaveOnlyWritableDataProperties()"
                               );
    if (!bVar2) goto LAB_00d03d6e;
    *puVar4 = 0;
  }
  BVar3 = Js::Type::ThisAndPrototypesHaveNoSpecialProperties
                    ((this->super_DynamicObject).super_RecyclableObject.type.ptr);
  if (BVar3 != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptRegularExpression.cpp"
                                ,0x16,
                                "(!this->GetType()->ThisAndPrototypesHaveNoSpecialProperties())",
                                "!this->GetType()->ThisAndPrototypesHaveNoSpecialProperties()");
    if (!bVar2) {
LAB_00d03d6e:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  if (DAT_015bc478 != '\x01') {
    return;
  }
  this_00 = Js::Type::GetScriptContext(&type->super_Type);
  this_01 = ScriptContext::GetRegexDebugWriter(this_00);
  if (pattern != (RegexPattern *)0x0) {
    UnifiedRegex::DebugWriter::Print(this_01,L"// REGEX CREATE ");
    UnifiedRegex::RegexPattern::Print(pattern,this_01);
    UnifiedRegex::DebugWriter::EOL(this_01);
    return;
  }
  UnifiedRegex::DebugWriter::PrintEOL(this_01,L"// REGEX CREATE");
  return;
}

Assistant:

JavascriptRegExp::JavascriptRegExp(UnifiedRegex::RegexPattern* pattern, DynamicType* type) :
        DynamicObject(type),
        pattern(pattern),
        splitPattern(nullptr),
        lastIndexVar(nullptr),
        lastIndexOrFlag(0)
    {
        Assert(type->GetTypeId() == TypeIds_RegEx);
        Assert(!this->GetType()->AreThisAndPrototypesEnsuredToHaveOnlyWritableDataProperties());
        Assert(!this->GetType()->ThisAndPrototypesHaveNoSpecialProperties());

#if ENABLE_REGEX_CONFIG_OPTIONS
        if (REGEX_CONFIG_FLAG(RegexTracing))
        {
            UnifiedRegex::DebugWriter* w = type->GetScriptContext()->GetRegexDebugWriter();
            if (pattern == 0)
                w->PrintEOL(_u("// REGEX CREATE"));
            else
            {
                w->Print(_u("// REGEX CREATE "));
                pattern->Print(w);
                w->EOL();
            }
        }
#endif
    }